

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

Block * __thiscall soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,Block *b)

{
  pointer ppVar1;
  pool_ref<soul::AST::Statement> *s;
  pointer s_00;
  
  ppVar1 = (b->statements).
           super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (s_00 = (b->statements).
              super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
              ._M_impl.super__Vector_impl_data._M_start; s_00 != ppVar1; s_00 = s_00 + 1) {
    replaceStatement(this,s_00);
  }
  return b;
}

Assistant:

virtual AST::Block& visit (AST::Block& b)
    {
        for (auto& s : b.statements)
            replaceStatement (s);

        return b;
    }